

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

ostream * Search::operator<<(ostream *os,action_cache *x)

{
  ostream *poVar1;
  
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  poVar1 = std::operator<<(poVar1,':');
  std::ostream::operator<<(poVar1,x->cost);
  if (x->is_opt == true) {
    std::operator<<(os,'*');
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const action_cache& x)
{
  os << x.k << ':' << x.cost;
  if (x.is_opt)
    os << '*';
  return os;
}